

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# powell.hpp
# Opt level: O2

double optimize(double initial,function<double_(double)> *loss)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined8 local_60;
  undefined8 local_48;
  undefined8 local_38;
  
  dVar1 = std::function<double_(double)>::operator()(loss,initial);
  local_48 = initial + -1.0;
  local_60 = 1.0;
  local_38 = initial + 1.0;
  dVar2 = std::function<double_(double)>::operator()(loss,local_48);
  dVar3 = std::function<double_(double)>::operator()(loss,local_38);
  while (dVar2 <= dVar1) {
    local_48 = local_48 - local_60;
    dVar2 = std::function<double_(double)>::operator()(loss,local_48);
    local_60 = local_60 + local_60;
  }
  dVar2 = 1.0;
  while( true ) {
    if (dVar1 < dVar3) break;
    local_38 = local_38 + dVar2;
    dVar3 = std::function<double_(double)>::operator()(loss,local_38);
    dVar2 = dVar2 + dVar2;
  }
  dVar1 = (local_38 - local_48) * 0.6180339887498949;
  dVar3 = local_38 - dVar1;
  dVar1 = dVar1 + local_48;
  dVar4 = std::function<double_(double)>::operator()(loss,dVar3);
  dVar2 = std::function<double_(double)>::operator()(loss,dVar1);
  while (dVar7 = dVar3, dVar5 = dVar2, dVar3 = dVar1, 1e-05 < ABS(dVar7 - dVar3)) {
    if (dVar5 <= dVar4) {
      dVar1 = (local_38 - dVar3) * -0.6180339887498949 + local_38;
      dVar2 = std::function<double_(double)>::operator()(loss,dVar1);
      dVar4 = dVar5;
      local_48 = dVar7;
    }
    else {
      dVar5 = (dVar7 - local_48) * 0.6180339887498949 + local_48;
      dVar6 = std::function<double_(double)>::operator()(loss,dVar5);
      local_38 = dVar3;
      dVar1 = dVar7;
      dVar2 = dVar4;
      dVar3 = dVar5;
      dVar4 = dVar6;
    }
  }
  dVar1 = (local_48 + local_38) * 0.5;
  dVar2 = std::function<double_(double)>::operator()(loss,dVar1);
  dVar3 = std::function<double_(double)>::operator()(loss,initial);
  return (double)(~-(ulong)(dVar3 < dVar2) & (ulong)dVar1 | (ulong)initial & -(ulong)(dVar3 < dVar2)
                 );
}

Assistant:

double optimize(double initial, std::function<double(double)> loss)
{
	// determine search interval
	double f_initial = loss(initial);
	double l = initial-1, r = initial+1;
	double fl = loss(l), fr = loss(r);
	for (double d=1; fl <= f_initial; d*=2) {
		l -= d;
		fl = loss(l);
	}
	for (double d=1; fr <= f_initial; d*=2) {
		r += d;
		fr = loss(r);
	}
	// Golden-section search
	const double gr = (std::sqrt(5.0) - 1) / 2;
    double c = r - (r-l) * gr;
    double d = l + (r-l) * gr;
    double fc = loss(c);
    double fd = loss(d);
    while (std::abs(c - d) > 1e-5) {
        if (fc < fd)
        {
            r = d;
            d = c;
            fd = fc;
            c = l + (d-l) * gr;
            fc = loss(c);
        }
        else
        {
            l = c;
            c = d;
            fc = fd;
            d = r - (r-c) * gr;
            fd = loss(d);
        }
    }
    // check if we have really done at least some optimization
    if (loss((l+r)/2) > loss(initial))
    	return initial;
    return (l+r)/2;
}